

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O3

char * __thiscall SimpleStringInternalCache::alloc(SimpleStringInternalCache *this,size_t size)

{
  SimpleStringInternalCacheNode *pSVar1;
  int iVar2;
  size_t i;
  long lVar3;
  SimpleStringMemoryBlock *pSVar4;
  char *pcVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SimpleStringInternalCacheNode *pSVar7;
  ulong uVar8;
  SimpleStringMemoryBlock *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (size < 0x101) {
    pSVar1 = this->cache_;
    lVar3 = 0;
    pSVar7 = pSVar1;
    do {
      if (size <= pSVar7->size_) goto LAB_002b51a7;
      lVar3 = lVar3 + 1;
      pSVar7 = pSVar7 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
LAB_002b51a7:
    if (pSVar1[lVar3].freeMemoryHead_ == (SimpleStringMemoryBlock *)0x0) {
      lVar3 = 0;
      pSVar7 = pSVar1;
      do {
        uVar8 = pSVar7->size_;
        if (size <= uVar8) goto LAB_002b525e;
        lVar3 = lVar3 + 1;
        pSVar7 = pSVar7 + 1;
      } while (lVar3 != 5);
      uVar8 = pSVar1->size_;
      lVar3 = 0;
LAB_002b525e:
      iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                        (this->allocator_,0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                         ,0x67);
      pSVar6 = (SimpleStringMemoryBlock *)CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                        (this->allocator_,uVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                         ,0x68);
      pcVar5 = (char *)CONCAT44(extraout_var_02,iVar2);
      pSVar6->memory_ = pcVar5;
      pSVar6->next_ = pSVar1[lVar3].usedMemoryHead_;
      pSVar1[lVar3].usedMemoryHead_ = pSVar6;
    }
    else {
      lVar3 = 0;
      pSVar7 = pSVar1;
      do {
        if (size <= pSVar7->size_) goto LAB_002b51d0;
        lVar3 = lVar3 + 1;
        pSVar7 = pSVar7 + 1;
      } while (lVar3 != 5);
      lVar3 = 0;
LAB_002b51d0:
      pSVar6 = pSVar1[lVar3].freeMemoryHead_;
      pSVar1[lVar3].freeMemoryHead_ = pSVar6->next_;
      pSVar6->next_ = pSVar1[lVar3].usedMemoryHead_;
      pSVar1[lVar3].usedMemoryHead_ = pSVar6;
      pcVar5 = pSVar6->memory_;
    }
  }
  else {
    pSVar6 = this->nonCachedAllocations_;
    iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                      (this->allocator_,0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                       ,0x67);
    pSVar4 = (SimpleStringMemoryBlock *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                      (this->allocator_,size,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                       ,0x68);
    pcVar5 = (char *)CONCAT44(extraout_var_00,iVar2);
    pSVar4->memory_ = pcVar5;
    pSVar4->next_ = pSVar6;
    this->nonCachedAllocations_ = pSVar4;
  }
  return pcVar5;
}

Assistant:

char* SimpleStringInternalCache::alloc(size_t size)
{
    if (isCached(size)) {
        if (hasFreeBlocksOfSize(size))
            return reserveCachedBlockFrom(getCacheNodeFromSize(size))->memory_;
        else
            return allocateNewCacheBlockFrom(getCacheNodeFromSize(size))->memory_;
    }

    nonCachedAllocations_ = createSimpleStringMemoryBlock(size, nonCachedAllocations_);
    return nonCachedAllocations_->memory_;
}